

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

int nng_url_clone(nng_url **dstp,nng_url *src)

{
  int iVar1;
  nng_url *dst;
  
  dst = (nng_url *)nni_zalloc(200);
  if (dst == (nng_url *)0x0) {
    iVar1 = 2;
  }
  else {
    iVar1 = nni_url_clone_inline(dst,src);
    if (iVar1 == 0) {
      *dstp = dst;
      iVar1 = 0;
    }
    else {
      nni_free(dst,200);
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

int
nng_url_clone(nng_url **dstp, const nng_url *src)
{
	nng_url *dst;
	int      rv;
	if ((dst = NNI_ALLOC_STRUCT(dst)) == NULL) {
		return (NNG_ENOMEM);
	}
	if ((rv = nni_url_clone_inline(dst, src) != 0)) {
		NNI_FREE_STRUCT(dst);
		return (rv);
	}
	*dstp = dst;
	return (0);
}